

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

natwm_error monitors_from_xinerama(natwm_state *state,list **result)

{
  natwm_error nVar1;
  monitor *data;
  monitor *monitor;
  size_t i;
  monitor *pmStack_38;
  natwm_error err;
  size_t monitor_length;
  xcb_rectangle_t *rects;
  list *monitor_list;
  list **result_local;
  natwm_state *state_local;
  
  monitor_list = (list *)result;
  result_local = (list **)state;
  rects = (xcb_rectangle_t *)list_create();
  if ((list *)rects == (list *)0x0) {
    state_local._4_4_ = MEMORY_ALLOCATION_ERROR;
  }
  else {
    monitor_length = 0;
    pmStack_38 = (monitor *)0x0;
    nVar1 = xinerama_get_screens
                      ((natwm_state *)result_local,(xcb_rectangle_t **)&monitor_length,
                       (size_t *)&stack0xffffffffffffffc8);
    if (nVar1 == NO_ERROR) {
      for (monitor = (monitor *)0x0; monitor < pmStack_38;
          monitor = (monitor *)((long)&monitor->id + 1)) {
        data = monitor_create((uint32_t)monitor,
                              *(xcb_rectangle_t *)(monitor_length + (long)monitor * 8),
                              (workspace *)0x0);
        if (data == (monitor *)0x0) {
          monitors_destroy((list *)rects);
          list_destroy((list *)rects);
          free((void *)monitor_length);
          return MEMORY_ALLOCATION_ERROR;
        }
        list_insert((list *)rects,data);
      }
      free((void *)monitor_length);
      monitor_list->head = (node *)rects;
      state_local._4_4_ = NO_ERROR;
    }
    else {
      list_destroy((list *)rects);
      state_local._4_4_ = nVar1;
    }
  }
  return state_local._4_4_;
}

Assistant:

static enum natwm_error monitors_from_xinerama(const struct natwm_state *state,
                                               struct list **result)
{
        struct list *monitor_list = list_create();

        if (monitor_list == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        xcb_rectangle_t *rects = NULL;
        size_t monitor_length = 0;
        enum natwm_error err = xinerama_get_screens(state, &rects, &monitor_length);

        if (err != NO_ERROR) {
                list_destroy(monitor_list);

                return err;
        }

        for (size_t i = 0; i < monitor_length; ++i) {
                struct monitor *monitor = monitor_create((uint32_t)i, rects[i], NULL);

                if (monitor == NULL) {
                        monitors_destroy(monitor_list);
                        list_destroy(monitor_list);
                        free(rects);

                        return MEMORY_ALLOCATION_ERROR;
                }

                list_insert(monitor_list, monitor);
        }

        free(rects);

        *result = monitor_list;

        return NO_ERROR;
}